

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enoent.cpp
# Opt level: O1

int main(void)

{
  int __oflag;
  system_error e;
  embedded_filesystem fs;
  long *local_58 [2];
  long local_48 [2];
  embedded_filesystem local_38 [3];
  
  local_38[0] = cmrc::enoent::get_filesystem();
  local_58[0] = local_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_58,"hello.txt","");
  cmrc::embedded_filesystem::open(local_38,(char *)local_58,__oflag);
  if (local_58[0] != local_48) {
    operator_delete(local_58[0],local_48[0] + 1);
  }
  return 0;
}

Assistant:

int main() {
    auto fs = cmrc::enoent::get_filesystem();
    try {
        auto data = fs.open("hello.txt");
    } catch (std::system_error e) {
        if (e.code() == std::errc::no_such_file_or_directory) {
            return 1;
        }
    }
    return 0;
}